

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_cursor<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::
initialize_with_string_view
          (basic_csv_cursor<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          string_view_type sv)

{
  error_code ec;
  ser_error *psVar1;
  const_pointer pvVar2;
  error_code *this_00;
  size_t line;
  size_type sVar3;
  ulong uVar4;
  long lVar5;
  ser_error *in_RDI;
  basic_csv_parser<char,_std::allocator<char>_> *this_01;
  type tVar6;
  size_t offset;
  type r;
  size_t in_stack_ffffffffffffff78;
  json_errc __e;
  char *in_stack_ffffffffffffff80;
  error_code *column;
  error_category *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  tVar6 = unicode_traits::detect_json_encoding<char>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  __e = (json_errc)(in_stack_ffffffffffffff78 >> 0x20);
  if ((tVar6.encoding != utf8) && (tVar6.encoding != undetected)) {
    this_00 = (error_code *)__cxa_allocate_exception(0x58);
    column = this_00;
    std::error_code::error_code<jsoncons::json_errc,void>(this_00,__e);
    this_01 = (basic_csv_parser<char,_std::allocator<char>_> *)((long)&in_RDI[4].what_.field_2 + 8);
    line = basic_csv_parser<char,_std::allocator<char>_>::line(this_01);
    basic_csv_parser<char,_std::allocator<char>_>::column(this_01);
    ec._M_cat = in_stack_ffffffffffffffb0;
    ec._0_8_ = pvVar2;
    ser_error::ser_error(in_RDI,ec,line,(size_t)column);
    __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
  }
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  lVar5 = (long)tVar6.ptr - (long)pvVar2;
  psVar1 = in_RDI + 4;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  pvVar2 = pvVar2 + lVar5;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  basic_csv_parser<char,_std::allocator<char>_>::update
            ((basic_csv_parser<char,_std::allocator<char>_> *)((long)&(psVar1->what_).field_2 + 8),
             pvVar2,sVar3 - lVar5);
  uVar4 = (**(code **)(*(long *)in_RDI + 0x18))();
  if ((uVar4 & 1) == 0) {
    (**(code **)(*(long *)in_RDI + 0x38))();
  }
  return;
}

Assistant:

void initialize_with_string_view(string_view_type sv)
    {
        auto r = unicode_traits::detect_json_encoding(sv.data(), sv.size());
        if (!(r.encoding == unicode_traits::encoding_kind::utf8 || r.encoding == unicode_traits::encoding_kind::undetected))
        {
            JSONCONS_THROW(ser_error(json_errc::illegal_unicode_character,parser_.line(),parser_.column()));
        }
        std::size_t offset = (r.ptr - sv.data());
        parser_.update(sv.data()+offset,sv.size()-offset);
        if (!done())
        {
            next();
        }
    }